

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O3

int mtar_finalize(mtar_t *tar)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  char nul;
  undefined1 local_19;
  
  local_19 = 0;
  lVar2 = 0x3ff;
  do {
    iVar1 = (*tar->write)(tar,&local_19,1);
    tar->pos = tar->pos + 1;
    bVar3 = lVar2 != 0;
    lVar2 = lVar2 + -1;
    if (iVar1 != 0) {
      return iVar1;
    }
  } while (bVar3);
  return 0;
}

Assistant:

int mtar_finalize(mtar_t *tar) {
  /* Write two NULL records */
  return mtar_write_null_bytes(tar, sizeof(mtar_raw_header_t) * 2);
}